

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

Element * __thiscall
Rml::ElementDocument::FindNextNavigationElement
          (ElementDocument *this,Element *current_element,NavigationSearchDirection direction,
          Property *property)

{
  element_type *peVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  bool bVar4;
  uint uVar5;
  Element *pEVar6;
  Box *this_00;
  ElementDocument *this_01;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ElementDocument *element;
  SearchNavigationResult best_result;
  undefined1 local_68 [16];
  BoundingBox bounding_box;
  float local_38;
  float fStack_34;
  
  if (property->unit == KEYWORD) {
    uVar5 = Variant::Get<int>(&property->value,0);
    if ((char)uVar5 == '\0') {
      return (Element *)0x0;
    }
    if ((uVar5 & 0xff) == 3) {
      if (direction < Left) goto LAB_0028df10;
    }
    else if (((uVar5 & 0xff) != 2) || ((direction & ~Down) == Left)) {
LAB_0028df10:
      if ((ElementDocument *)current_element == this) {
        pEVar6 = FindNextTabElement(this,&this->super_Element,(direction & ~Left) == Down);
        return pEVar6;
      }
      VVar2 = Element::GetAbsoluteOffset(current_element,Border);
      this_00 = Element::GetBox(current_element);
      VVar3 = Box::GetSize(this_00,Border);
      local_38 = VVar2.x;
      fStack_34 = VVar2.y;
      bounding_box.max.x = VVar3.x + local_38;
      bounding_box.max.y = VVar3.y + fStack_34;
      bounding_box.min.x = local_38;
      bounding_box.min.y = fStack_34;
      this_01 = (ElementDocument *)current_element;
      do {
        this_01 = (ElementDocument *)Element::GetParentNode(&this_01->super_Element);
        element = this;
        if (this_01 == (ElementDocument *)0x0) break;
        bVar4 = anon_unknown_0::IsScrollContainer((Element *)this_01);
        element = this_01;
      } while (!bVar4);
      best_result.element = (Element *)0x0;
      best_result.heuristic = 0x7fffffff;
      anon_unknown_0::SearchNavigationTarget
                (&best_result,&element->super_Element,direction,&bounding_box,current_element);
      return best_result.element;
    }
  }
  else if (property->unit == STRING) {
    peVar1 = (property->source).
             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bounding_box,
               property);
    pcVar8 = (char *)CONCAT44(bounding_box.min.y,bounding_box.min.x);
    if (*pcVar8 == '#') {
      best_result.element = (Element *)local_68;
      ::std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&best_result,pcVar8 + 1,
                 pcVar8 + CONCAT44(bounding_box.max.y,bounding_box.max.x));
      pEVar6 = Element::GetElementById(&this->super_Element,(String *)&best_result);
      if (pEVar6 == (Element *)0x0) {
        if (peVar1 == (element_type *)0x0) {
          uVar9 = 0xffffffffffffffff;
          pcVar8 = "";
        }
        else {
          pcVar8 = (peVar1->path)._M_dataplus._M_p;
          uVar9 = (ulong)(uint)peVar1->line_number;
        }
        Log::Message(LT_WARNING,
                     "Trying to navigate to element with id \'%s\', but could not find element. Declared at %s:%d"
                     ,best_result.element,pcVar8,uVar9);
      }
      ::std::__cxx11::string::~string((string *)&best_result);
    }
    else {
      if (peVar1 == (element_type *)0x0) {
        uVar9 = 0xffffffffffffffff;
        pcVar7 = "";
      }
      else {
        pcVar7 = (peVar1->path)._M_dataplus._M_p;
        uVar9 = (ulong)(uint)peVar1->line_number;
      }
      pEVar6 = (Element *)0x0;
      Log::Message(LT_WARNING,
                   "Invalid navigation value \'%s\': Expected a keyword or a string with an element id prefixed with \'#\'. Declared at %s:%d"
                   ,pcVar8,pcVar7,uVar9);
    }
    ::std::__cxx11::string::~string((string *)&bounding_box);
    return pEVar6;
  }
  return (Element *)0x0;
}

Assistant:

Element* ElementDocument::FindNextNavigationElement(Element* current_element, NavigationSearchDirection direction, const Property& property)
{
	switch (property.unit)
	{
	case Unit::STRING:
	{
		const PropertySource* source = property.source.get();
		const String value = property.Get<String>();
		if (value[0] != '#')
		{
			Log::Message(Log::LT_WARNING,
				"Invalid navigation value '%s': Expected a keyword or a string with an element id prefixed with '#'. Declared at %s:%d",
				value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
			return nullptr;
		}

		const String id = String(value.begin() + 1, value.end());
		Element* result = GetElementById(id);
		if (!result)
		{
			Log::Message(Log::LT_WARNING, "Trying to navigate to element with id '%s', but could not find element. Declared at %s:%d", id.c_str(),
				source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		return result;
	}
	break;
	case Unit::KEYWORD:
	{
		const bool direction_is_horizontal = (direction == NavigationSearchDirection::Left || direction == NavigationSearchDirection::Right);
		const bool direction_is_vertical = (direction == NavigationSearchDirection::Up || direction == NavigationSearchDirection::Down);
		switch (static_cast<Style::Nav>(property.value.Get<int>()))
		{
		case Style::Nav::None: return nullptr;
		case Style::Nav::Auto: break;
		case Style::Nav::Horizontal:
			if (!direction_is_horizontal)
				return nullptr;
			break;
		case Style::Nav::Vertical:
			if (!direction_is_vertical)
				return nullptr;
			break;
		}
	}
	break;
	default: return nullptr;
	}

	if (current_element == this)
	{
		const bool direction_is_forward = (direction == NavigationSearchDirection::Down || direction == NavigationSearchDirection::Right);
		return FindNextTabElement(this, direction_is_forward);
	}

	const Vector2f position = current_element->GetAbsoluteOffset(BoxArea::Border);
	const BoundingBox bounding_box = {position, position + current_element->GetBox().GetSize(BoxArea::Border)};

	auto GetNearestScrollContainer = [this](Element* element) -> Element* {
		for (element = element->GetParentNode(); element; element = element->GetParentNode())
		{
			if (IsScrollContainer(element))
				return element;
		}
		return this;
	};
	Element* start_element = GetNearestScrollContainer(current_element);

	SearchNavigationResult best_result;
	SearchNavigationTarget(best_result, start_element, direction, bounding_box, current_element);
	return best_result.element;
}